

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::Federate(Federate *this,Federate *fed)

{
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this->_vptr_Federate = (_func_int **)&PTR__Federate_004b4a40;
  this->currentMode = STARTUP;
  this->nameSegmentSeparator = '/';
  this->strictConfigChecking = true;
  this->hasPotentialInterfaces = false;
  this->useJsonSerialization = false;
  this->observerMode = false;
  this->retriggerTimeRequest = false;
  this->singleThreadFederate = false;
  (this->fedID).fid = -2000000000;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mCurrentTime).internalTimeCode = -0x7fffffffffffffff;
  (this->mStopTime).internalTimeCode = 0x7fffffffffffffff;
  (this->configFile)._M_dataplus._M_p = (pointer)&(this->configFile).field_2;
  (this->configFile)._M_string_length = 0;
  (this->configFile).field_2._M_local_buf[0] = '\0';
  (this->asyncCallInfo)._M_t.
  super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  .
  super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
  ._M_head_impl = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x0;
  (this->cManager)._M_t.
  super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
  .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl =
       (ConnectorFederateManager *)0x0;
  *(undefined8 *)
   ((long)&(this->cManager)._M_t.
           super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
           .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)
   ((long)&(this->potManager)._M_t.
           super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
           .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl + 4) = 0
  ;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  (this->mName)._M_string_length = 0;
  (this->mName).field_2._M_local_buf[0] = '\0';
  memset(&this->timeRequestEntryCallback,0,0x100);
  LOCK();
  (this->currentMode)._M_i = (fed->currentMode)._M_i;
  UNLOCK();
  LOCK();
  (fed->currentMode)._M_i = FINALIZE;
  UNLOCK();
  (this->fedID).fid = (fed->fedID).fid;
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
             &(fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>);
  CoreFactory::getEmptyCore();
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
             &local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->mCurrentTime).internalTimeCode = (fed->mCurrentTime).internalTimeCode;
  this->nameSegmentSeparator = fed->nameSegmentSeparator;
  this->strictConfigChecking = fed->strictConfigChecking;
  this->observerMode = fed->observerMode;
  std::
  __uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator=((__uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)&this->asyncCallInfo,
              (__uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)&fed->asyncCallInfo);
  std::
  __uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator=((__uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)&this->cManager,
              (__uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)&fed->cManager);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->mName,&fed->mName);
  return;
}

Assistant:

Federate::Federate(Federate&& fed) noexcept
{
    auto tmode = fed.currentMode.load();
    currentMode.store(tmode);
    fed.currentMode.store(Modes::FINALIZE);
    fedID = fed.fedID;
    coreObject = std::move(fed.coreObject);
    fed.coreObject = CoreFactory::getEmptyCore();
    mCurrentTime = fed.mCurrentTime;
    nameSegmentSeparator = fed.nameSegmentSeparator;
    strictConfigChecking = fed.strictConfigChecking;
    observerMode = fed.observerMode;
    asyncCallInfo = std::move(fed.asyncCallInfo);
    cManager = std::move(fed.cManager);
    mName = std::move(fed.mName);
}